

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_list.c
# Opt level: O2

int main(int argc,char **argv)

{
  list_entity *plVar1;
  list_entity **pplVar2;
  int iVar3;
  list_entity *plVar4;
  uint uVar5;
  undefined1 uVar6;
  char *pcVar7;
  list_element *plVar8;
  list_entity *plVar9;
  list_element *plVar10;
  long lVar11;
  list_element *plVar12;
  list_entity *plVar13;
  long lVar14;
  ulong uVar15;
  list_entity local_48;
  list_element *local_38;
  
  uVar6 = SUB81(argv,0);
  plVar13 = &local_48;
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_add_tail");
  head.prev = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  cunit_named_check(head.next == &elements1[0].node,"test_add_tail",0x62,"head->next");
  cunit_named_check(head.prev == &elements1[5].node,"test_add_tail",99,"head->prev");
  cunit_named_check(elements1[0].node.prev == &head,"test_add_tail",100,"elements1[0]->prev");
  pcVar7 = "test_add_tail";
  cunit_named_check(elements1[5].node.next == &head,"test_add_tail",0x65,"elements1[%d]->next");
  lVar14 = 0x1050b0;
  for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
    pcVar7 = "test_add_tail";
    cunit_named_check(lVar14 == *(long *)(lVar14 + -0x18),"test_add_tail",0x68,"elements1[%d]->next"
                     );
    lVar14 = lVar14 + 0x18;
  }
  uVar5 = 1;
  local_38 = elements1;
  for (lVar11 = 0; uVar6 = SUB81(pcVar7,0), lVar11 != 0x78; lVar11 = lVar11 + 0x18) {
    pcVar7 = "test_add_tail";
    cunit_named_check(lVar11 + 0x105098 == *(long *)((long)&elements1[1].node.prev + lVar11),
                      "test_add_tail",0x6b,"elements1[%d]->prev",(ulong)uVar5);
    uVar5 = uVar5 + 1;
  }
  cunit_end_test("test_add_tail");
  cunit_start_test("test_add_head");
  head.prev = &head;
  head.next = &head;
  uVar5 = 1;
  add_elements((list_element *)0x1,(_Bool)uVar6);
  cunit_named_check(head.next == &elements1[5].node,"test_add_head",0x77,"head->next");
  cunit_named_check(head.prev == &elements1[0].node,"test_add_head",0x78,"head->prev");
  cunit_named_check(elements1[5].node.prev == &head,"test_add_head",0x79,"elements1[%d]->prev");
  pcVar7 = "test_add_head";
  cunit_named_check(elements1[0].node.next == &head,"test_add_head",0x7a,"elements1[0]->next");
  lVar14 = 0x1050b0;
  for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
    pcVar7 = "test_add_head";
    cunit_named_check(lVar14 == *(long *)(lVar14 + -0x10),"test_add_head",0x7d,"elements1[%d]->prev"
                     );
    lVar14 = lVar14 + 0x18;
  }
  for (lVar11 = 0; uVar6 = SUB81(pcVar7,0), lVar11 != 0x78; lVar11 = lVar11 + 0x18) {
    pcVar7 = "test_add_head";
    cunit_named_check(lVar11 + 0x105098 == *(long *)((long)&elements1[1].node.next + lVar11),
                      "test_add_head",0x80,"elements1[%d]->next",(ulong)uVar5);
    uVar5 = uVar5 + 1;
  }
  cunit_end_test("test_add_head");
  cunit_start_test("test_add_before");
  plVar9 = &head;
  head.prev = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  plVar4 = elements1[3].node.prev;
  elements2[0].node.next = &elements1[3].node;
  elements2[0].node.prev = elements1[3].node.prev;
  elements1[3].node.prev = &elements2[0].node;
  plVar4->next = (list_entity *)0x105128;
  cunit_named_check(elements1[2].node.next == &elements2[0].node,"test_add_before",0x8c,
                    "elements1[2]->next");
  cunit_named_check(elements1[3].node.prev == &elements2[0].node,"test_add_before",0x8d,
                    "elements1[3]->prev");
  cunit_named_check(elements2[0].node.next == &elements1[3].node,"test_add_before",0x8e,
                    "elements2[0]->next");
  uVar6 = 0xa0;
  cunit_named_check(elements2[0].node.prev == &elements1[2].node,"test_add_before",0x8f,
                    "elements2[0]->prev");
  cunit_end_test("test_add_before");
  cunit_start_test("test_add_after");
  head.prev = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  elements2[0].node.next = elements1[2].node.next;
  elements2[0].node.prev = &elements1[2].node;
  (elements1[2].node.next)->prev = &elements2[0].node;
  elements1[2].node.next = &elements2[0].node;
  cunit_named_check(true,"test_add_after",0x9a,"elements1[2]->next");
  cunit_named_check(elements1[3].node.prev == &elements2[0].node,"test_add_after",0x9b,
                    "elements1[3]->prev");
  cunit_named_check(elements2[0].node.next == &elements1[3].node,"test_add_after",0x9c,
                    "elements2[0]->next");
  uVar6 = 0xfc;
  cunit_named_check(elements2[0].node.prev == &elements1[2].node,"test_add_after",0x9d,
                    "elements2[0]->prev");
  cunit_end_test("test_add_after");
  cunit_start_test("test_remove");
  head.prev = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  (elements1[2].node.prev)->next = elements1[2].node.next;
  (elements1[2].node.next)->prev = elements1[2].node.prev;
  elements1[2].node = (list_entity)ZEXT816(0);
  cunit_named_check(elements1[1].node.next == &elements1[3].node,"test_remove",0xa8,
                    "elements1[1]->next");
  cunit_named_check(elements1[3].node.prev == &elements1[1].node,"test_remove",0xa9,
                    "elements1[3]->prev");
  cunit_named_check(elements1[2].node.next == (list_entity *)0x0,"test_remove",0xaa,
                    "elements1[2]->next");
  cunit_named_check(elements1[2].node.prev == (list_entity *)0x0,"test_remove",0xab,
                    "elements1[2]->prev");
  cunit_end_test("test_remove");
  cunit_start_test("test_conditions");
  head.prev = &head;
  head.next = &head;
  cunit_named_check(true,"test_conditions",0xb3,"list_is_empty (1)");
  uVar6 = 0x3d;
  cunit_named_check(elements1[0].node.prev == (list_entity *)0x0 ||
                    elements1[0].node.next == (list_entity *)0x0,"test_conditions",0xb4,
                    "list_node_added (1)");
  add_elements((list_element *)0x0,(_Bool)uVar6);
  cunit_named_check(head.prev != &head || head.next != &head,"test_conditions",0xb8,
                    "list_is_empty (1)");
  cunit_named_check(elements1[0].node.prev != (list_entity *)0x0 &&
                    elements1[0].node.next != (list_entity *)0x0,"test_conditions",0xb9,
                    "list_node_added (1)");
  cunit_named_check(head.next == &elements1[0].node,"test_conditions",0xbb,"list_is_first (1)");
  cunit_named_check(head.prev == &elements1[5].node,"test_conditions",0xbc,"list_is_last (1)");
  cunit_named_check(head.next != &elements1[1].node,"test_conditions",0xbd,"list_is_first (2)");
  cunit_named_check(head.prev != &elements1[1].node,"test_conditions",0xbe,"list_is_last (2)");
  cunit_end_test("test_conditions");
  cunit_start_test("test_merge");
  head.prev = &head;
  head.next = &head;
  local_48.next = &local_48;
  local_48.prev = &local_48;
  cunit_named_check(true,"test_merge",0xcb,"list_is_empty (1)");
  cunit_named_check(elements1[0].node.prev == (list_entity *)0x0 ||
                    elements1[0].node.next == (list_entity *)0x0,"test_merge",0xcc,
                    "list_node_added (1)");
  uVar6 = 0xa7;
  cunit_named_check(elements2[0].node.prev == (list_entity *)0x0 ||
                    elements2[0].node.next == (list_entity *)0x0,"test_merge",0xcd,
                    "list_node_added (1)");
  add_elements((list_element *)0x0,(_Bool)uVar6);
  plVar12 = elements2;
  for (lVar11 = 0; lVar11 != 0x90; lVar11 = lVar11 + 0x18) {
    plVar4 = (list_entity *)((long)&elements2[0].node.next + lVar11);
    plVar4->next = &local_48;
    *(list_entity **)((long)&elements2[0].node.prev + lVar11) = local_48.prev;
    pplVar2 = &(local_48.prev)->next;
    local_48.prev = plVar4;
    *pplVar2 = plVar4;
  }
  uVar15 = 0;
  while (plVar10 = local_38, plVar9 = plVar9->next, plVar9->prev != head.prev) {
    cunit_named_check(local_38 == (list_element *)&plVar9[-1].prev,"test_merge",0xd8,
                      "for_each iteration %d failed",uVar15 & 0xffffffff);
    uVar15 = uVar15 + 1;
    local_38 = plVar10 + 1;
  }
  cunit_named_check(uVar15 == 6,"test_merge",0xdb,"missing elements from list 1");
  uVar15 = 0;
  while (plVar13 = plVar13->next, *(list_entity **)((long)plVar13 + 8) != local_48.prev) {
    cunit_named_check(plVar12 == (list_element *)((long)plVar13 + -8),"test_merge",0xdf,
                      "for_each iteration %d failed",uVar15 & 0xffffffff);
    uVar15 = uVar15 + 1;
    plVar12 = plVar12 + 1;
  }
  cunit_named_check(uVar15 == 6,"test_merge",0xe2,"missing elements from list 2");
  if ((local_48.next != &local_48) || (local_48.prev != &local_48)) {
    (head.prev)->next = local_48.next;
    (local_48.next)->prev = head.prev;
    head.prev = local_48.prev;
    (local_48.prev)->next = &head;
    local_48.next = &local_48;
    local_48.prev = &local_48;
  }
  cunit_named_check(true,"test_merge",0xe5,"list_is_empty (2)");
  plVar9 = &head;
  cunit_named_check(head.prev != &head || head.next != &head,"test_merge",0xe6,"!list_is_empty (1)")
  ;
  plVar10 = elements1;
  plVar12 = elements1;
  uVar15 = 0;
  plVar13 = &head;
  while (plVar13 = plVar13->next, plVar13->prev != head.prev) {
    plVar8 = plVar12;
    if (5 >= uVar15) {
      plVar8 = plVar10;
    }
    cunit_named_check((list_element *)&plVar13[-1].prev == plVar8,"test_merge",
                      (uint)(5 < uVar15) * 3 + 0xeb,"for_each iteration %d failed",
                      uVar15 & 0xffffffff);
    uVar15 = uVar15 + 1;
    plVar10 = plVar10 + 1;
    plVar12 = plVar12 + 1;
  }
  uVar6 = 0xa7;
  cunit_named_check(uVar15 == 0xc,"test_merge",0xf2,"missing elements from merged list");
  cunit_end_test("test_merge");
  cunit_start_test("test_element_macros");
  head.prev = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  plVar10 = elements1;
  cunit_named_check(head.next == &elements1[0].node,"test_element_macros",0xfd,"list_first_element")
  ;
  plVar12 = elements1 + 5;
  cunit_named_check(head.prev == &elements1[5].node,"test_element_macros",0xfe,"list_first_element")
  ;
  lVar11 = 0x1050a8;
  cunit_named_check(elements1[0].node.next == &elements1[1].node,"test_element_macros",0x100,
                    "list_next_element(elements1[0])");
  uVar6 = 0x50;
  cunit_named_check(elements1[1].node.prev == &elements1[0].node,"test_element_macros",0x101,
                    "list_prev_element(elements1[1])");
  cunit_end_test("test_element_macros");
  cunit_start_test("test_for_each_macros");
  head.prev = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  uVar15 = 0;
  while (plVar9 = plVar9->next, plVar9->prev != head.prev) {
    cunit_named_check(plVar10 == (list_element *)&plVar9[-1].prev,"test_for_each_macros",0x10f,
                      "for_each iteration %d failed",uVar15 & 0xffffffff);
    uVar15 = uVar15 + 1;
    plVar10 = plVar10 + 1;
  }
  cunit_named_check(uVar15 == 6,"test_for_each_macros",0x112,"for_each only had %d of %d iterations"
                    ,uVar15 & 0xffffffff,6);
  uVar15 = 0;
  for (lVar14 = 0x1050a8; *(long *)(lVar14 + 0x10) != 0x1050f8; lVar14 = *(long *)(lVar14 + 8) + -8)
  {
    uVar15 = uVar15 + 1;
    cunit_named_check(lVar11 == lVar14,"test_for_each_macros",0x116,
                      "for_element_range iteration %d failed",uVar15 & 0xffffffff);
    lVar11 = lVar11 + 0x18;
  }
  cunit_named_check(uVar15 == 4,"test_for_each_macros",0x119,
                    "for_element_range only had %d of %d iterations",uVar15 & 0xffffffff,4);
  lVar11 = 0x1050a8;
  uVar15 = 0;
  for (lVar14 = 0x1050a8; *(list_entity **)(lVar14 + 0x10) != head.prev;
      lVar14 = *(long *)(lVar14 + 8) + -8) {
    uVar15 = uVar15 + 1;
    cunit_named_check(lVar11 == lVar14,"test_for_each_macros",0x11d,
                      "element_to_last iteration %d failed",uVar15 & 0xffffffff);
    lVar11 = lVar11 + 0x18;
  }
  cunit_named_check(uVar15 == 5,"test_for_each_macros",0x120,
                    "element_to_last only had %d of %d iterations",uVar15 & 0xffffffff,5);
  plVar13 = &head;
  plVar10 = elements1;
  uVar15 = 0;
  while( true ) {
    plVar13 = plVar13->next;
    if (plVar13->prev == (list_entity *)0x1050f8) break;
    cunit_named_check(plVar10 == (list_element *)&plVar13[-1].prev,"test_for_each_macros",0x124,
                      "first_to_element iteration %d failed",uVar15 & 0xffffffff);
    uVar15 = uVar15 + 1;
    plVar10 = plVar10 + 1;
  }
  uVar6 = 0xb7;
  cunit_named_check(uVar15 == 5,"test_for_each_macros",0x127,
                    "first_to_element only had %d of %d iterations",(ulong)((int)uVar15 - 1),5);
  cunit_end_test("test_for_each_macros");
  cunit_start_test("test_for_each_reverse_macros");
  head.prev = &head;
  plVar13 = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  uVar5 = 0;
  while (plVar13 = plVar13->prev, plVar13->next != head.next) {
    cunit_named_check(plVar12 == (list_element *)&plVar13[-1].prev,"test_for_each_reverse_macros",
                      0x137,"for_each iteration %d failed",(ulong)uVar5);
    uVar5 = uVar5 + 1;
    plVar12 = plVar12 + -1;
  }
  cunit_named_check(uVar5 == 6,"test_for_each_reverse_macros",0x13b,
                    "for_each only had %d of %d iterations",(ulong)uVar5,6);
  lVar14 = 0x1050f0;
  uVar5 = 0;
  for (lVar11 = 0x1050f0; *(long *)(lVar11 + 8) != 0x1050b0; lVar11 = *(long *)(lVar11 + 0x10) + -8)
  {
    uVar5 = uVar5 + 1;
    cunit_named_check(lVar14 == lVar11,"test_for_each_reverse_macros",0x140,
                      "for_element_range iteration %d failed",(ulong)uVar5);
    lVar14 = lVar14 + -0x18;
  }
  cunit_named_check(uVar5 == 4,"test_for_each_reverse_macros",0x144,
                    "for_element_range only had %d of %d iterations",(ulong)uVar5,4);
  plVar13 = &head;
  plVar12 = elements1 + 5;
  uVar5 = 0;
  while (plVar13 = plVar13->prev, plVar13->next != (list_entity *)0x1050b0) {
    uVar5 = uVar5 + 1;
    cunit_named_check(plVar12 == (list_element *)&plVar13[-1].prev,"test_for_each_reverse_macros",
                      0x149,"element_to_last iteration %d failed",(ulong)uVar5);
    plVar12 = plVar12 + -1;
  }
  cunit_named_check(uVar5 == 5,"test_for_each_reverse_macros",0x14d,
                    "element_to_last only had %d of %d iterations",(ulong)uVar5,5);
  lVar14 = 0x1050f0;
  uVar5 = 0xffffffff;
  for (lVar11 = 0x1050f0; *(list_entity **)(lVar11 + 8) != head.next;
      lVar11 = *(long *)(lVar11 + 0x10) + -8) {
    uVar5 = uVar5 + 1;
    cunit_named_check(lVar14 == lVar11,"test_for_each_reverse_macros",0x152,
                      "first_to_element iteration %d failed",(ulong)uVar5);
    lVar14 = lVar14 + -0x18;
  }
  uVar6 = 0xeb;
  cunit_named_check(uVar5 == 4,"test_for_each_reverse_macros",0x156,
                    "first_to_element only had %d of %d iterations",(ulong)uVar5,5);
  cunit_end_test("test_for_each_reverse_macros");
  cunit_start_test("test_for_each_save_macro");
  head.prev = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  plVar12 = elements1;
  uVar15 = 0;
  plVar13 = head.next;
  while (plVar13->prev != head.prev) {
    plVar9 = plVar13->next;
    cunit_named_check(plVar12 == (list_element *)&plVar13[-1].prev,"test_for_each_save_macro",0x166,
                      "for_each_save iteration %d failed",uVar15 & 0xffffffff);
    plVar4 = plVar13->next;
    plVar1 = plVar13->prev;
    plVar1->next = plVar4;
    plVar4->prev = plVar1;
    uVar15 = uVar15 + 1;
    plVar13->next = (list_entity *)0x0;
    plVar13->prev = (list_entity *)0x0;
    plVar12 = plVar12 + 1;
    plVar13 = plVar9;
  }
  cunit_named_check(uVar15 == 6,"test_for_each_save_macro",0x16a,
                    "for_each_save only had %d of %d iterations",uVar15 & 0xffffffff,6);
  uVar6 = 8;
  cunit_named_check(head.prev == &head && head.next == &head,"test_for_each_save_macro",0x16b,
                    "for_each_save list not empty after loop with remove");
  cunit_end_test("test_for_each_save_macro");
  cunit_start_test("test_for_each_reverse_save_macro");
  head.prev = &head;
  head.next = &head;
  add_elements((list_element *)0x0,(_Bool)uVar6);
  plVar12 = elements1 + 5;
  uVar5 = 0;
  plVar13 = head.prev;
  while (plVar13->next != head.next) {
    plVar9 = plVar13->prev;
    cunit_named_check(plVar12 == (list_element *)&plVar13[-1].prev,
                      "test_for_each_reverse_save_macro",0x17a,"for_each_save iteration %d failed",
                      (ulong)uVar5);
    plVar4 = plVar13->next;
    plVar1 = plVar13->prev;
    plVar1->next = plVar4;
    plVar4->prev = plVar1;
    uVar5 = uVar5 + 1;
    plVar13->next = (list_entity *)0x0;
    plVar13->prev = (list_entity *)0x0;
    plVar12 = plVar12 + -1;
    plVar13 = plVar9;
  }
  cunit_named_check(uVar5 == 6,"test_for_each_reverse_save_macro",0x17f,
                    "for_each_save only had %d of %d iterations",(ulong)uVar5,6);
  cunit_named_check(head.prev == &head && head.next == &head,"test_for_each_reverse_save_macro",
                    0x180,"for_each_save list not empty after loop with remove");
  cunit_end_test("test_for_each_reverse_save_macro");
  iVar3 = FINISH_TESTING();
  return iVar3;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(clear_elements);

  test_add_tail();
  test_add_head();
  test_add_before();
  test_add_after();
  test_remove();
  test_conditions();
  test_merge();
  test_element_macros();
  test_for_each_macros();
  test_for_each_reverse_macros();
  test_for_each_save_macro();
  test_for_each_reverse_save_macro();

  return FINISH_TESTING();
}